

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::AsyncIoStreamWithGuards::write(AsyncIoStreamWithGuards *this,int __fd,void *__buf,size_t __n)

{
  AsyncIoStreamWithGuards *node;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> *pAVar1;
  AsyncIoStreamWithGuards *local_48;
  ArrayPtr<const_unsigned_char> *local_40;
  _func_int **local_38;
  EventLoop *local_30;
  
  pAVar1 = (ArrayPtr<const_unsigned_char> *)CONCAT44(in_register_00000034,__fd);
  if (*(byte *)((long)&pAVar1[4].size_ + 1) == '\x01') {
    (**(code **)(*(long *)(pAVar1[2].ptr + 8) + 8))(this,pAVar1[2].ptr + 8,__buf,__n);
  }
  else {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffb8);
    local_40 = pAVar1;
    local_38 = (_func_int **)__buf;
    local_30 = (EventLoop *)__n;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>
              ((Promise<void> *)this,(anon_class_24_2_4df0a340_for_func *)&stack0xffffffffffffffb8);
    node = local_48;
    if (local_48 != (AsyncIoStreamWithGuards *)0x0) {
      local_48 = (AsyncIoStreamWithGuards *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    if (writeGuardReleased) {
      return inner->write(pieces);
    } else {
      return writeGuard.addBranch().then([this, pieces]() {
        return inner->write(pieces);
      });
    }
  }